

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paladin.c
# Opt level: O3

void spell_blinding_orb(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  CHAR_DATA *pCVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  short sVar6;
  CHAR_DATA *bch;
  short local_12a6;
  AFFECT_DATA af;
  char buf2 [4608];
  
  act("You bring forth an orb of blinding light to sear the eyes of your foes!",ch,(void *)0x0,
      (void *)0x0,3);
  act("$n calls forth a brilliant orb of radiant light!",ch,(void *)0x0,(void *)0x0,0);
  pCVar1 = ch->in_room->people;
  do {
    while( true ) {
      do {
        do {
          do {
            bch = pCVar1;
            if (bch == (CHAR_DATA *)0x0) {
              return;
            }
            pCVar1 = bch->next_in_room;
            bVar2 = is_same_group(ch,bch);
          } while (bVar2);
          bVar2 = is_same_cabal(ch,bch);
        } while (bVar2);
        bVar2 = is_safe(ch,bch);
      } while (bVar2);
      iVar3 = dice(level,2);
      bVar2 = is_good(bch);
      if (bVar2) break;
      bVar2 = is_neutral(bch);
      if (!bVar2) {
        iVar3 = (int)((double)iVar3 * 1.5);
        local_12a6 = 6;
        sVar6 = -0x10;
        goto LAB_0034f8eb;
      }
      iVar4 = number_percent();
      if (iVar4 < 0x4c) {
        iVar3 = iVar3 / 2;
        local_12a6 = 3;
        sVar6 = -8;
LAB_0034f8eb:
        pcVar5 = pers(ch,bch);
        sprintf(buf2,"Die, %s, you sorcerous dog!",pcVar5);
        if (bch->fighting == (CHAR_DATA *)0x0) {
          bVar2 = is_npc(bch);
          if (!bVar2) {
            do_myell(bch,buf2,ch);
          }
        }
        damage_new(ch,bch,iVar3,sn,0xf,true,false,0,1,(char *)0x0);
        bVar2 = saves_spell((int)ch->level,bch,0xf);
        if (!bVar2) {
          bVar2 = is_affected_by(bch,0);
          if (!bVar2) {
            act("$n falters as the light sears $s eyes.",bch,(void *)0x0,ch,0);
            act("You are blinded by the bright light!",ch,(void *)0x0,bch,2);
            init_affect(&af);
            af.where = 0;
            af.type = (short)sn;
            af.aftype = 4;
            af.location = 0x12;
            af.bitvector[0]._0_1_ = (byte)af.bitvector[0] | 1;
            af.duration = local_12a6;
            af.mod_name = 0;
            af.level = (short)level;
            af.modifier = sVar6;
            affect_to_char(bch,&af);
          }
        }
      }
    }
    iVar4 = number_percent();
  } while (0x19 < iVar4);
  iVar3 = iVar3 / 3;
  local_12a6 = 1;
  sVar6 = -4;
  goto LAB_0034f8eb;
}

Assistant:

void spell_blinding_orb(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo, *vch_next;
	AFFECT_DATA af;
	int dam, hitroll, duration, b_hitroll, b_duration;

	act("You bring forth an orb of blinding light to sear the eyes of your foes!", ch, 0, 0, TO_CHAR);
	act("$n calls forth a brilliant orb of radiant light!", ch, 0, 0, TO_ROOM);

	for (victim = ch->in_room->people; victim != nullptr; victim = vch_next)
	{
		vch_next = victim->next_in_room;

		if (is_same_group(ch, victim) || is_same_cabal(ch, victim) || is_safe(ch, victim))
			continue;

		dam = dice(level, 2);

		b_hitroll = -4;
		b_duration = 1;

		if (is_good(victim))
		{
			if (number_percent() > 25)
				continue;

			dam /= 3;
			hitroll = b_hitroll;
			duration = b_duration;
		}
		else if (is_neutral(victim))
		{
			if (number_percent() > 75)
				continue;

			dam /= 2;
			hitroll = b_hitroll * 2;
			duration = b_duration * 3;
		}
		else
		{
			dam = (int)(dam * 1.5);
			hitroll = b_hitroll * 4;
			duration = b_duration * 6;
		}

		char buf2[MSL];
		sprintf(buf2, "Die, %s, you sorcerous dog!", pers(ch, victim));

		if (!victim->fighting && !is_npc(victim))
			do_myell(victim, buf2, ch);

		damage_new(ch, victim, dam, sn, DAM_LIGHT, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, nullptr);

		if (!saves_spell(ch->level, victim, DAM_LIGHT) && !is_affected_by(victim, AFF_BLIND))
		{
			act("$n falters as the light sears $s eyes.", victim, 0, ch, TO_ROOM);
			act("You are blinded by the bright light!", ch, 0, victim, TO_VICT);

			init_affect(&af);
			af.where = TO_AFFECTS;
			af.type = sn;
			af.aftype = AFT_COMMUNE;
			af.level = level;
			af.location = APPLY_HITROLL;
			af.modifier = hitroll;
			SET_BIT(af.bitvector, AFF_BLIND);
			af.duration = duration;
			af.mod_name = MOD_VISION;
			affect_to_char(victim, &af);
		}
	}
}